

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O0

void __thiscall PointerBasedIterator_Assign_Test::TestBody(PointerBasedIterator_Assign_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  const_reference pos;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  const_iterator c;
  array<const_int,_2UL> carr;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  iterator a;
  iterator b;
  array<int,_2UL> arr;
  PointerBasedIterator_Assign_Test *this_local;
  
  b.pos_ = (pointer)0x500000003;
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&b,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>(&a,pvVar2 + 2);
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&b,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>
            ((pointer_based_iterator<int> *)&gtest_ar.message_,pvVar2);
  a.pos_ = (pointer)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_38,"b","a",&a,(pointer_based_iterator<int> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&carr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&carr,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&carr);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  c.pos_ = (pointer)0xb00000007;
  pos = std::array<const_int,_2UL>::operator[]((array<const_int,_2UL> *)&c,0);
  this_00 = &gtest_ar_1.message_;
  pstore::pointer_based_iterator<int_const>::pointer_based_iterator<int,void>
            ((pointer_based_iterator<int_const> *)this_00,pos);
  pstore::pointer_based_iterator<int_const>::operator=
            ((pointer_based_iterator<int_const> *)this_00,
             (pointer_based_iterator<int> *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<const_int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_78,"c","a",(pointer_based_iterator<const_int> *)this_00,
             (pointer_based_iterator<int> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, Assign) {
    std::array<int, 2> arr{{3, 5}};
    iterator b{&arr[0] + 2};
    iterator a{&arr[0]};
    b = a;
    EXPECT_EQ (b, a);

    std::array<int const, 2> const carr{{7, 11}};
    const_iterator c{&carr[0]};
    c = a;
    EXPECT_EQ (c, a);
}